

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateExtkeyRequest,cfd::js::api::json::CreateExtkeyResponse,cfd::js::api::CreateExtkeyRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_630;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_578 [4];
  JsonClassBase<cfd::js::api::json::CreateExtkeyResponse> local_558 [4];
  undefined1 local_538 [8];
  CreateExtkeyResponse res_2;
  undefined1 local_4d8 [8];
  CreateExtkeyResponseStruct response;
  CreateExtkeyRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_128 [8];
  CreateExtkeyRequest req;
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._256_8_ = call_function;
  CreateExtkeyRequest::CreateExtkeyRequest((CreateExtkeyRequest *)local_128);
  core::JsonClassBase<cfd::js::api::json::CreateExtkeyRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::CreateExtkeyRequest> *)local_128,request_message);
  CreateExtkeyRequest::ConvertToStruct
            ((CreateExtkeyRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (CreateExtkeyRequest *)local_128);
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyRequestStruct_&)>
  ::operator()((CreateExtkeyResponseStruct *)local_4d8,call_function,
               (CreateExtkeyRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    CreateExtkeyResponse::CreateExtkeyResponse((CreateExtkeyResponse *)local_538);
    CreateExtkeyResponse::ConvertFromStruct
              ((CreateExtkeyResponse *)local_538,(CreateExtkeyResponseStruct *)local_4d8);
    core::JsonClassBase<cfd::js::api::json::CreateExtkeyResponse>::Serialize_abi_cxx11_(local_558);
    std::__cxx11::string::operator=((string *)this,(string *)local_558);
    std::__cxx11::string::~string((string *)local_558);
    CreateExtkeyResponse::~CreateExtkeyResponse((CreateExtkeyResponse *)local_538);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_630,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_578);
    std::__cxx11::string::operator=((string *)this,(string *)local_578);
    std::__cxx11::string::~string((string *)local_578);
    ErrorResponse::~ErrorResponse(&local_630);
  }
  res_2._87_1_ = 1;
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct((CreateExtkeyResponseStruct *)local_4d8);
  CreateExtkeyRequestStruct::~CreateExtkeyRequestStruct
            ((CreateExtkeyRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CreateExtkeyRequest::~CreateExtkeyRequest((CreateExtkeyRequest *)local_128);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}